

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O1

void __thiscall helics::Federate::enterInitializingModeAsync(Federate *this)

{
  element_type *peVar1;
  Modes MVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Result<bool> *p_Var5;
  InvalidFunctionCall *this_00;
  char *pcVar6;
  size_t sVar7;
  _State_baseV2 *__tmp;
  bool bVar8;
  string_view message;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  handle asyncInfo;
  __state_type local_88;
  long *local_70;
  __basic_future<bool> local_68;
  _func_int **local_58 [2];
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *local_48;
  unique_lock<std::mutex> local_40;
  
  if (this->singleThreadFederate == true) {
    this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    pcVar6 = "Async function calls and methods are not allowed for single thread federates";
    sVar7 = 0x4c;
LAB_0022667c:
    message._M_str = pcVar6;
    message._M_len = sVar7;
    InvalidFunctionCall::InvalidFunctionCall(this_00,message);
    __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
  }
  MVar2 = (this->currentMode)._M_i;
  if ((MVar2 != PENDING_INIT) && (MVar2 != INITIALIZING)) {
    if (MVar2 != STARTUP) {
      this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
      pcVar6 = "cannot transition from current mode to initializing mode";
      sVar7 = 0x38;
      goto LAB_0022667c;
    }
    local_48 = (this->asyncCallInfo)._M_t.
               super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               .
               super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
               ._M_head_impl;
    local_40._M_device = &local_48->m_mutex;
    local_40._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_40);
    local_40._M_owns = true;
    LOCK();
    bVar8 = (this->currentMode)._M_i == STARTUP;
    if (bVar8) {
      (this->currentMode)._M_i = PENDING_INIT;
    }
    UNLOCK();
    if (bVar8) {
      local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
      p_Var4->_M_use_count = 1;
      p_Var4->_M_weak_count = 1;
      p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00525aa0;
      peVar1 = (element_type *)(p_Var4 + 1);
      p_Var4[2]._M_use_count = 0;
      p_Var4[1]._M_use_count = 0;
      p_Var4[1]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var4[1]._M_weak_count + 1) = 0;
      p_Var4[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var4[3]._M_use_count = 0;
      p_Var4[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00525af0;
      p_Var5 = (_Result<bool> *)operator_new(0x18);
      std::__future_base::_Result<bool>::_Result(p_Var5);
      p_Var4[4]._vptr__Sp_counted_base = (_func_int **)p_Var5;
      *(Federate **)&p_Var4[4]._M_use_count = this;
      local_58[0] = (_func_int **)0x0;
      local_70 = (long *)operator_new(0x20);
      *local_70 = (long)&PTR___State_00525b48;
      local_70[1] = (long)peVar1;
      local_70[2] = (long)std::__future_base::
                          _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:302:68)>_>,_bool>
                          ::_M_run;
      local_70[3] = 0;
      std::thread::_M_start_thread(local_58,&local_70,0);
      if (local_70 != (long *)0x0) {
        (**(code **)(*local_70 + 8))();
      }
      _Var3._M_pi = local_88.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      if (p_Var4[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
        std::terminate();
      }
      p_Var4[3]._vptr__Sp_counted_base = local_58[0];
      bVar8 = local_88.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar1;
      local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var4;
      if (bVar8) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
      }
      if (local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
        p_Var4->_M_use_count = 1;
        p_Var4->_M_weak_count = 1;
        p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00525b88;
        p_Var4[2]._M_use_count = 0;
        p_Var4[1]._M_use_count = 0;
        p_Var4[1]._M_weak_count = 0;
        *(undefined8 *)((long)&p_Var4[1]._M_weak_count + 1) = 0;
        p_Var4[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00525bd8;
        p_Var5 = (_Result<bool> *)operator_new(0x18);
        std::__future_base::_Result<bool>::_Result(p_Var5);
        _Var3._M_pi = local_88.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        p_Var4[3]._vptr__Sp_counted_base = (_func_int **)p_Var5;
        *(Federate **)&p_Var4[3]._M_use_count = this;
        bVar8 = local_88.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)(p_Var4 + 1);
        local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var4;
        if (bVar8) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
        }
      }
      std::__basic_future<bool>::__basic_future(&local_68,&local_88);
      if (local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      _Var3._M_pi = local_68._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      peVar1 = local_68._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_68._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_68._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var4 = (local_48->m_obj).initFuture.super___basic_future<bool>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (local_48->m_obj).initFuture.super___basic_future<bool>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar1;
      (local_48->m_obj).initFuture.super___basic_future<bool>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Var3._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
      if (local_68._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
  }
  return;
}

Assistant:

void Federate::enterInitializingModeAsync()
{
    if (singleThreadFederate) {
        throw(InvalidFunctionCall(
            "Async function calls and methods are not allowed for single thread federates"));
    }
    auto cmode = currentMode.load();
    if (cmode == Modes::STARTUP) {
        auto asyncInfo = asyncCallInfo->lock();
        if (currentMode.compare_exchange_strong(cmode, Modes::PENDING_INIT)) {
            asyncInfo->initFuture = std::async(std::launch::async, [this]() {
                if (hasPotentialInterfaces) {
                    potentialInterfacesStartupSequence();
                }
                return coreObject->enterInitializingMode(fedID);
            });
        }
    } else if (cmode == Modes::PENDING_INIT) {
        return;
    } else if (cmode != Modes::INITIALIZING) {
        // if we are already in initialization do nothing
        throw(InvalidFunctionCall("cannot transition from current mode to initializing mode"));
    }
}